

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receiver_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Receiver_PDU::Encode(Receiver_PDU *this,KDataStream *stream)

{
  Radio_Communications_Header::Encode(&this->super_Radio_Communications_Header,stream);
  KDataStream::Write<unsigned_short>
            (stream,*(unsigned_short *)&(this->super_Radio_Communications_Header).field_0x3a);
  KDataStream::Write<unsigned_short>
            (stream,*(unsigned_short *)&(this->super_Radio_Communications_Header).field_0x3c);
  KDataStream::Write<float>(stream,(float)this->m_f32RecPwr);
  (*(this->m_TransmitterEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase
    [5])(&this->m_TransmitterEntityID,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16TransmitterRadioID);
  return;
}

Assistant:

void Receiver_PDU::Encode( KDataStream & stream ) const
{
    Radio_Communications_Header::Encode( stream );

    stream << m_ui16ReceiverState
           << m_ui16Padding1
           << m_f32RecPwr
           << KDIS_STREAM m_TransmitterEntityID
           << m_ui16TransmitterRadioID;
}